

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hpp
# Opt level: O2

void __thiscall Options::Options(Options *this)

{
  (this->attrmap).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
  super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
  super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
  *(undefined2 *)(this->baseTileIDs)._M_elems = 0;
  this->reversedWidth = 0;
  this->useColorCurve = false;
  this->allowMirroring = false;
  this->allowMirroring = false;
  this->allowDedup = false;
  this->columnMajor = false;
  this->verbosity = '\0';
  *(undefined8 *)&this->palSpecType = 0;
  *(undefined8 *)
   ((long)&(this->palSpec).
           super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->palSpec).super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->palSpec).super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bitDepth = '\x02';
  (this->inputSlice).left = 0;
  (this->inputSlice).top = 0;
  (this->inputSlice).width = 0;
  (this->inputSlice).height = 0;
  *(undefined4 *)(this->maxNbTiles)._M_elems = 0xffff;
  this->nbPalettes = '\b';
  (this->output).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
  super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
  super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
  (this->palettes).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
  super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
  super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
  (this->palmap).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
  super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
  super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
  this->nbColorsPerPal = '\0';
  (this->tilemap).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
  super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
  super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
  this->trim = 0;
  (this->input).super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
  super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
  super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged = false;
  this->hasTransparentPixels = false;
  return;
}

Assistant:

bool reverse() const { return reversedWidth != 0; }